

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall
capnp::Orphan<capnp::DynamicValue>::Orphan
          (Orphan<capnp::DynamicValue> *this,Builder *value,OrphanBuilder *builder)

{
  char *pcVar1;
  size_t sVar2;
  
  this->type = value->type;
  capnp::_::OrphanBuilder::OrphanBuilder(&this->builder,builder);
  switch(this->type) {
  case BOOL:
    (this->field_1).boolValue = (value->field_1).boolValue;
    break;
  case FLOAT:
    (this->field_1).intValue = (value->field_1).intValue;
    break;
  case LIST:
    pcVar1 = (value->field_1).textValue.content.ptr;
    (this->field_1).intValue = (value->field_1).intValue;
    *(char **)((long)&this->field_1 + 8) = pcVar1;
    break;
  case ENUM:
    (this->field_1).enumValue.value =
         *(uint16_t *)&(value->field_1).listValue.schema.elementType.field_4;
  case INT:
  case UINT:
  case STRUCT:
    sVar2 = (value->field_1).intValue;
    goto LAB_0017e909;
  case CAPABILITY:
    sVar2 = (value->field_1).textValue.content.size_;
LAB_0017e909:
    (this->field_1).intValue = sVar2;
  }
  return;
}

Assistant:

Orphan<DynamicValue>::Orphan(DynamicValue::Builder value, _::OrphanBuilder&& builder)
    : type(value.getType()), builder(kj::mv(builder)) {
  switch (type) {
    case DynamicValue::UNKNOWN: break;
    case DynamicValue::VOID: voidValue = value.voidValue; break;
    case DynamicValue::BOOL: boolValue = value.boolValue; break;
    case DynamicValue::INT: intValue = value.intValue; break;
    case DynamicValue::UINT: uintValue = value.uintValue; break;
    case DynamicValue::FLOAT: floatValue = value.floatValue; break;
    case DynamicValue::ENUM: enumValue = value.enumValue; break;

    case DynamicValue::TEXT: break;
    case DynamicValue::DATA: break;
    case DynamicValue::LIST: listSchema = value.listValue.getSchema(); break;
    case DynamicValue::STRUCT: structSchema = value.structValue.getSchema(); break;
    case DynamicValue::CAPABILITY: interfaceSchema = value.capabilityValue.getSchema(); break;
    case DynamicValue::ANY_POINTER: break;
  }
}